

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *action,
          MessageLite *message)

{
  string asStack_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (**(code **)(*(long *)action + 0x10))(asStack_38,action);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(asStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (**(code **)(*(long *)action + 0x48))(asStack_38,action);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

string InitializationErrorMessage(const char* action,
                                  const MessageLite& message) {
  // Note:  We want to avoid depending on strutil in the lite library, otherwise
  //   we'd use:
  //
  // return strings::Substitute(
  //   "Can't $0 message of type \"$1\" because it is missing required "
  //   "fields: $2",
  //   action, message.GetTypeName(),
  //   message.InitializationErrorString());

  string result;
  result += "Can't ";
  result += action;
  result += " message of type \"";
  result += message.GetTypeName();
  result += "\" because it is missing required fields: ";
  result += message.InitializationErrorString();
  return result;
}